

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O2

double L18_4::use_f<double,L18_4::Fq>(double v,Fq f)

{
  use_f<double,_L18_4::Fq>::count = use_f<double,_L18_4::Fq>::count + 1;
  std::operator<<((ostream *)&std::cout," use_f count = ");
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }